

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O1

void Abc_NtkAigToGiaOne(Gia_Man_t *p,Abc_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  long *plVar1;
  Gia_Obj_t *pGVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  Hop_Obj_t *pObj;
  
  if ((pNtk->ntkFunc != ABC_FUNC_AIG) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsAigLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                  ,0x60,"void Abc_NtkAigToGiaOne(Gia_Man_t *, Abc_Ntk_t *, Vec_Int_t *)");
  }
  plVar1 = (long *)pNtk->pManFunc;
  *(undefined4 *)plVar1[3] = 1;
  Abc_NtkCleanCopy(pNtk);
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      if (vMap->nSize <= lVar5) {
LAB_002ac91a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = vMap->pArray[lVar5];
      if (((long)iVar4 < 0) || (p->vCis->nSize <= iVar4)) goto LAB_002ac91a;
      iVar4 = p->vCis->pArray[iVar4];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      pGVar9 = (Gia_Obj_t *)((ulong)(pGVar2 + iVar4) & 0xfffffffffffffffe);
      if ((pGVar9 < pGVar2) || (pGVar2 + p->nObjs <= pGVar9)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar8 = (int)((ulong)((long)pGVar9 - (long)pGVar2) >> 2);
      if (iVar8 * -0x55555555 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      *(uint *)((long)pVVar6->pArray[lVar5] + 0x40) =
           ((uint)(pGVar2 + iVar4) & 1) + iVar8 * 0x55555556;
      lVar5 = lVar5 + 1;
      pVVar6 = pNtk->vCis;
    } while (lVar5 < pVVar6->nSize);
  }
  pVVar6 = Abc_NtkDfs(pNtk,1);
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      plVar3 = (long *)pVVar6->pArray[lVar5];
      iVar4 = *(int *)((long)plVar3 + 0x1c);
      if (0 < iVar4) {
        lVar7 = 0;
        do {
          if (*(int *)(*plVar1 + 4) <= lVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          **(undefined4 **)(*(long *)(*plVar1 + 8) + lVar7 * 8) =
               *(undefined4 *)
                (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                          (long)*(int *)(plVar3[4] + lVar7 * 4) * 8) + 0x40);
          lVar7 = lVar7 + 1;
          iVar4 = *(int *)((long)plVar3 + 0x1c);
        } while (lVar7 < iVar4);
      }
      if ((int)plVar1[10] < iVar4) {
        __assert_fail("Abc_ObjFaninNum(pNode) <= Hop_ManPiNum(pHopMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDress3.c"
                      ,0x6e,"void Abc_NtkAigToGiaOne(Gia_Man_t *, Abc_Ntk_t *, Vec_Int_t *)");
      }
      pObj = (Hop_Obj_t *)(plVar3[7] & 0xfffffffffffffffe);
      iVar4 = Hop_DagSize(pObj);
      if (0 < iVar4) {
        Abc_ConvertHopToGia(p,pObj);
      }
      if ((pObj->field_0).iData < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      *(uint *)(plVar3 + 8) = *(uint *)(plVar3 + 7) & 1 ^ (pObj->field_0).iData;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      Gia_ManAppendCo(p,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar6->pArray[lVar5] + 0x20) + 8) +
                                          (long)**(int **)((long)pVVar6->pArray[lVar5] + 0x20) * 8)
                                + 0x40));
      lVar5 = lVar5 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar5 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Abc_NtkAigToGiaOne( Gia_Man_t * p, Abc_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Hop_Man_t * pHopMan;
    Hop_Obj_t * pHopObj;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    assert( Abc_NtkIsAigLogic(pNtk) );
    pHopMan = (Hop_Man_t *)pNtk->pManFunc;
    Hop_ManConst1(pHopMan)->iData = 1;
    // image primary inputs
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->iTemp = Gia_ManCiLit(p, Vec_IntEntry(vMap, i));
    // iterate through nodes used in the mapping
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        Abc_ObjForEachFanin( pNode, pFanin, k )
            Hop_ManPi(pHopMan, k)->iData = pFanin->iTemp;
        pHopObj = Hop_Regular( (Hop_Obj_t *)pNode->pData );
        assert( Abc_ObjFaninNum(pNode) <= Hop_ManPiNum(pHopMan) );
        if ( Hop_DagSize(pHopObj) > 0 )
            Abc_ConvertHopToGia( p, pHopObj );
        pNode->iTemp = Abc_LitNotCond( pHopObj->iData, Hop_IsComplement( (Hop_Obj_t *)pNode->pData ) );
    }
    Vec_PtrFree( vNodes );
    // create primary outputs
    Abc_NtkForEachCo( pNtk, pNode, i )
        Gia_ManAppendCo( p, Abc_ObjFanin0(pNode)->iTemp );
}